

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O2

void __thiscall
QRasterPaintEngine::fillPath(QRasterPaintEngine *this,QPainterPath *path,QSpanData *fillData)

{
  QRasterPaintEnginePrivate *this_00;
  QPaintEngineState *pQVar1;
  QRasterizer *this_01;
  bool bVar2;
  FillRule fillRule;
  ProcessSpans callback;
  QT_FT_Outline *outline;
  QRasterBuffer *in_R8;
  QPaintEngineState *pQVar3;
  long in_FS_OFFSET;
  undefined1 local_88 [32];
  undefined1 local_68 [12];
  Representation RStack_5c;
  QRectF local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (fillData->blend != (ProcessSpans)0x0) {
    this_00 = (QRasterPaintEnginePrivate *)(this->super_QPaintEngineEx).super_QPaintEngine.d_ptr.d;
    local_58.w._0_4_ = 0xffffffff;
    local_58.w._4_4_ = 0xffffffff;
    local_58.h._0_4_ = 0xffffffff;
    local_58.h._4_4_ = 0xffffffff;
    local_58.xp._0_4_ = 0xffffffff;
    local_58.xp._4_4_ = 0xffffffff;
    local_58.yp._0_4_ = 0xffffffff;
    local_58.yp._4_4_ = 0xffffffff;
    QPainterPath::controlPointRect(&local_58,path);
    pQVar1 = (this->super_QPaintEngineEx).super_QPaintEngine.state;
    pQVar3 = pQVar1 + -2;
    if (pQVar1 == (QPaintEngineState *)0x0) {
      pQVar3 = (QPaintEngineState *)0x0;
    }
    stack0xffffffffffffffa0 = &DAT_aaaaaaaaaaaaaaaa;
    local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QTransform::mapRect((QRectF *)local_88,(QTransform *)(pQVar3 + 0x36),&local_58);
    _local_68 = QRectF::toRect((QRectF *)local_88);
    callback = QRasterPaintEnginePrivate::getBrushFunc(this_00,(QRect *)local_68,fillData);
    bVar2 = true;
    if (((-0x800000 < (int)local_68._0_4_) && ((int)local_68._8_4_ < 0x800000)) &&
       (-0x800000 < (int)local_68._4_4_)) {
      bVar2 = 0x7fffff < RStack_5c.m_i;
    }
    if ((bVar2) ||
       ((pQVar3[0x105].dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
         super_QFlagsStorage<QPaintEngine::DirtyFlag>.i & 8) != 0)) {
      ensureOutlineMapper(this);
      outline = QOutlineMapper::convertPath((this_00->outlineMapper).d,path);
      QRasterPaintEnginePrivate::rasterize(this_00,outline,callback,fillData,in_R8);
    }
    else {
      QRasterPaintEnginePrivate::initializeRasterizer(this_00,fillData);
      this_01 = (this_00->rasterizer).d;
      QTransform::map((QTransform *)local_88,(QPainterPath *)(pQVar3 + 0x36));
      fillRule = QPainterPath::fillRule(path);
      QRasterizer::rasterize(this_01,(QPainterPath *)local_88,fillRule);
      QPainterPath::~QPainterPath((QPainterPath *)local_88);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRasterPaintEngine::fillPath(const QPainterPath &path, QSpanData *fillData)
{
#ifdef QT_DEBUG_DRAW
    qDebug() << " --- fillPath, bounds=" << path.boundingRect();
#endif

    if (!fillData->blend)
        return;

    Q_D(QRasterPaintEngine);

    const QRectF controlPointRect = path.controlPointRect();

    QRasterPaintEngineState *s = state();
    const QRect deviceRect = s->matrix.mapRect(controlPointRect).toRect();
    ProcessSpans blend = d->getBrushFunc(deviceRect, fillData);
    const bool do_clip = (deviceRect.left() < -QT_RASTER_COORD_LIMIT
                          || deviceRect.right() > QT_RASTER_COORD_LIMIT
                          || deviceRect.top() < -QT_RASTER_COORD_LIMIT
                          || deviceRect.bottom() > QT_RASTER_COORD_LIMIT);

    if (!s->flags.antialiased && !do_clip) {
        d->initializeRasterizer(fillData);
        d->rasterizer->rasterize(path * s->matrix, path.fillRule());
        return;
    }

    ensureOutlineMapper();
    d->rasterize(d->outlineMapper->convertPath(path), blend, fillData, d->rasterBuffer.data());
}